

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O0

void __thiscall QWidget::adjustSize(QWidget *this)

{
  long lVar1;
  bool bVar2;
  QWidgetPrivate *pQVar3;
  QSize this_00;
  long in_FS_OFFSET;
  QWidgetPrivate *d;
  QSize s;
  QLayout *in_stack_00000050;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = d_func((QWidget *)0x368679);
  ensurePolished((QWidget *)d);
  this_00 = QWidgetPrivate::adjustedSize((QWidgetPrivate *)this);
  if (pQVar3->layout != (QLayout *)0x0) {
    QLayout::activate(in_stack_00000050);
  }
  bVar2 = QSize::isValid((QSize *)this_00);
  if (bVar2) {
    resize((QWidget *)s,(QSize *)this);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidget::adjustSize()
{
    Q_D(QWidget);
    ensurePolished();
    QSize s = d->adjustedSize();

    if (d->layout)
        d->layout->activate();

    if (s.isValid())
        resize(s);
}